

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

bool AM_Responder(event_t *ev,bool last)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  bool bVar3;
  
  if ((automapactive) && ((byte)(ev->type - 1) < 2)) {
    if (am_followplayer.Value) {
      if ((ulong)(ushort)ev->data1 < 0x1c4) {
        __s1 = AutomapBindings.Binds[(ushort)ev->data1].Chars;
      }
      else {
        __s1 = (char *)0x0;
      }
      iVar2 = strncasecmp(__s1,"+am_pan",7);
      if (iVar2 == 0) goto LAB_003641c1;
    }
    bVar3 = false;
    bVar1 = C_DoKey(ev,&AutomapBindings,(FKeyBindings *)0x0);
    if ((bVar1) && (bVar3 = true, ev->type == '\x02' && !last)) {
      bVar3 = *Bindings.Binds[(ushort)ev->data1].Chars != '+';
    }
  }
  else {
LAB_003641c1:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AM_Responder (event_t *ev, bool last)
{
	if (automapactive && (ev->type == EV_KeyDown || ev->type == EV_KeyUp))
	{
		if (am_followplayer)
		{
			// check for am_pan* and ignore in follow mode
			const char *defbind = AutomapBindings.GetBind(ev->data1);
			if (!strnicmp(defbind, "+am_pan", 7)) return false;
		}

		bool res = C_DoKey(ev, &AutomapBindings, NULL);
		if (res && ev->type == EV_KeyUp && !last)
		{
			// If this is a release event we also need to check if it released a button in the main Bindings
			// so that that button does not get stuck.
			const char *defbind = Bindings.GetBind(ev->data1);
			return (defbind[0] != '+'); // Let G_Responder handle button releases
		}
		return res;
	}
	return false;
}